

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Kernel::ByteSizeLong(Kernel *this)

{
  size_t sVar1;
  uint uVar2;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    ((this->kernel_).linearkernel_)->_cached_size_ = 0;
    sVar1 = 2;
    break;
  case 2:
    uVar2 = -(uint)(((this->kernel_).rbfkernel_)->gamma_ != 0.0) & 1;
    ((this->kernel_).rbfkernel_)->_cached_size_ = uVar2 * 9;
    sVar1 = (ulong)uVar2 * 9 + 2;
    break;
  case 3:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::PolyKernel>((this->kernel_).polykernel_);
    goto LAB_001f341d;
  case 4:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SigmoidKernel>
                      ((this->kernel_).sigmoidkernel_);
LAB_001f341d:
    sVar1 = sVar1 + 1;
    break;
  default:
    sVar1 = 0;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t Kernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Kernel)
  size_t total_size = 0;

  switch (kernel_case()) {
    // .CoreML.Specification.LinearKernel linearKernel = 1;
    case kLinearKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.linearkernel_);
      break;
    }
    // .CoreML.Specification.RBFKernel rbfKernel = 2;
    case kRbfKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.rbfkernel_);
      break;
    }
    // .CoreML.Specification.PolyKernel polyKernel = 3;
    case kPolyKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.polykernel_);
      break;
    }
    // .CoreML.Specification.SigmoidKernel sigmoidKernel = 4;
    case kSigmoidKernel: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *kernel_.sigmoidkernel_);
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}